

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O0

TokenOrSyntax * __thiscall slang::syntax::TokenList::getChild(TokenList *this,size_t index)

{
  Token token;
  reference peVar1;
  size_type in_RDX;
  long in_RSI;
  TokenOrSyntax *in_RDI;
  TokenOrSyntax *pTVar2;
  
  pTVar2 = in_RDI;
  peVar1 = std::span<slang::parsing::Token,_18446744073709551615UL>::operator[]
                     ((span<slang::parsing::Token,_18446744073709551615UL> *)(in_RSI + 0x28),in_RDX)
  ;
  token.info = *(Info **)peVar1;
  token._0_8_ = pTVar2;
  TokenOrSyntax::TokenOrSyntax(in_RDI,token);
  return pTVar2;
}

Assistant:

void setChild(size_t index, TokenOrSyntax child) final { (*this)[index] = child.token(); }